

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  undefined8 *puVar1;
  void *pvVar2;
  undefined1 auVar3 [16];
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong *puVar7;
  long lVar8;
  Image pCVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  Grid grid;
  Path path;
  Grid local_58;
  Path local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Setup Grid Elements",0x13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  iVar4 = columns * rows;
  uVar12 = (ulong)iVar4;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar12;
  uVar5 = SUB168(auVar3 * ZEXT816(0x48),0);
  uVar6 = uVar5 + 8;
  if (0xfffffffffffffff7 < uVar5) {
    uVar6 = 0xffffffffffffffff;
  }
  uVar5 = 0xffffffffffffffff;
  if (SUB168(auVar3 * ZEXT816(0x48),8) == 0) {
    uVar5 = uVar6;
  }
  puVar7 = (ulong *)operator_new__(uVar5);
  *puVar7 = uVar12;
  local_58.nodes = (GridNode *)(puVar7 + 1);
  if (iVar4 != 0) {
    lVar10 = 0;
    do {
      *(undefined8 *)((long)&((local_58.nodes)->pos).x + lVar10) = 0;
      *(undefined4 *)((long)puVar7 + lVar10 + 0x10) = 0;
      *(undefined4 *)((long)puVar7 + lVar10 + 0x48) = 0;
      puVar1 = (undefined8 *)((long)puVar7 + lVar10 + 0x18);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)puVar7 + lVar10 + 0x24);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar10 = lVar10 + 0x48;
    } while (uVar12 * 0x48 != lVar10);
  }
  if (0 < rows) {
    iVar4 = 0;
    do {
      if (0 < columns) {
        lVar10 = 0;
        do {
          lVar8 = columns * iVar4 + lVar10;
          iVar11 = gridState[lVar8];
          local_58.nodes[lVar8].pos.x = (int)lVar10;
          *(int *)((long)puVar7 + lVar8 * 0x48 + 0xc) = iVar4;
          *(int *)(puVar7 + lVar8 * 9 + 2) = iVar11;
          pvVar2 = (void *)puVar7[lVar8 * 9 + 3];
          puVar7[lVar8 * 9 + 3] = 0;
          (puVar7 + lVar8 * 9 + 3)[1] = 0;
          puVar7[lVar8 * 9 + 5] = 0;
          if (pvVar2 != (void *)0x0) {
            operator_delete(pvVar2);
          }
          local_58.nodes[lVar8].neighbourCount = 0;
          local_58.nodes[lVar8].index = 0;
          lVar10 = lVar10 + 1;
        } while ((int)lVar10 < columns);
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 < rows);
  }
  local_58.rows = rows;
  local_58.columns = columns;
  Grid::setup_neighbours(&local_58);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Setting up Image",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  iVar4 = rows * size;
  iVar11 = size * columns;
  pCVar9 = get_image_from_grid(&local_58);
  stbi_write_png("1.path_to_find.png",iVar11,iVar4,4,pCVar9,iVar11 * 4);
  lVar10 = std::chrono::_V2::system_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Finding path....",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  find_path(&local_48,&local_58);
  if (0 < (long)local_48.number) {
    lVar8 = 0;
    do {
      local_48.grids.list[lVar8]->state = PATH;
      lVar8 = lVar8 + 1;
    } while (local_48.number != lVar8);
  }
  lVar8 = std::chrono::_V2::system_clock::now();
  printf("Pathfinding time is:- %5f\n",lVar8 - lVar10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Showing Result",0xe);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  pCVar9 = get_image_from_grid(&local_58);
  stbi_write_png("2.final_path.png",iVar11,iVar4,4,pCVar9,iVar11 * 4);
  if (*puVar7 != 0) {
    lVar10 = *puVar7 * 0x48;
    do {
      pvVar2 = *(void **)((long)puVar7 + lVar10 + -0x30);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2);
      }
      lVar10 = lVar10 + -0x48;
    } while (lVar10 != 0);
  }
  operator_delete__(puVar7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Finish!!!",9);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  return 0;
}

Assistant:

int main()
{
    // Setup Grid
    std::cout << "Setup Grid Elements" << std::endl;
    GridNode *nodes = new GridNode[rows * columns];
    for (int y = 0; y < rows; y++)
    {
        for (int x = 0; x < columns; x++)
        {
            nodes[y * columns + x] = GridNode(x, y, get_state_from_int(gridState[y * columns + x]));
        }
    }
    Grid grid(rows, columns, nodes);
    grid.setup_neighbours();

    // Get Image
    std::cout << "Setting up Image" << std::endl;
    int imgRows = rows * size;
    int imgColumns = columns * size;
    Image img = new Colori[imgRows * imgColumns];
    img = get_image_from_grid(&grid);
    stbi_write_png("1.path_to_find.png", imgColumns, imgRows, 4, (void *)img, imgColumns * sizeof(Colori));

    // Process Pathfinding
    auto start = std::chrono::high_resolution_clock::now();
    std::cout << "Finding path...." << std::endl;
    Path path = find_path(&grid);
    path.set_path();
    auto stop = std::chrono::high_resolution_clock::now();
    printf("Pathfinding time is:- %5f\n", std::chrono::duration_cast<std::chrono::nanoseconds>(stop - start).count());

    // Show final Result
    std::cout << "Showing Result" << std::endl;
    img = get_image_from_grid(&grid);

    stbi_write_png("2.final_path.png", imgColumns, imgRows, 4, (void *)img, imgColumns * sizeof(Colori));

    // Finish Program
    delete[] nodes;
    std::cout << "Finish!!!" << std::endl;
}